

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int parsedigit(char c)

{
  undefined4 local_c;
  char c_local;
  
  if ((c < '0') || ('9' < c)) {
    if ((c < 'a') || ('f' < c)) {
      if ((c < 'A') || ('F' < c)) {
        local_c = -1;
      }
      else {
        local_c = c + -0x41;
      }
    }
    else {
      local_c = c + -0x61;
    }
  }
  else {
    local_c = c + -0x30;
  }
  return local_c;
}

Assistant:

static int
parsedigit(char c)
{
	if (c >= '0' && c <= '9')
		return c - '0';
	else if (c >= 'a' && c <= 'f')
		return c - 'a';
	else if (c >= 'A' && c <= 'F')
		return c - 'A';
	else
		return -1;
}